

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O2

bool __thiscall
Merge::collectCorrectable
          (Merge *this,vector<Varnode_*,_std::allocator<Varnode_*>_> *vlist,
          list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *oplist,
          vector<int,_std::allocator<int>_> *slotlist,PcodeOp *op)

{
  int4 i;
  pointer ppVVar1;
  Varnode *this_00;
  uintm uVar2;
  int4 iVar3;
  uintm uVar4;
  Cover *this_01;
  CoverBlock *this_02;
  _List_node_base *p_Var5;
  int4 slot;
  PcodeOp *edgeop;
  int4 local_54;
  pointer local_50;
  PcodeOp *local_48;
  PcodeOp *local_40;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *local_38;
  
  i = (op->parent->super_FlowBlock).index;
  local_40 = op;
  uVar2 = CoverBlock::getUIndex(op);
  local_38 = vlist;
  for (local_50 = (vlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      ppVVar1 = (local_38->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                super__Vector_impl_data._M_finish, local_50 != ppVVar1; local_50 = local_50 + 1) {
    this_00 = *local_50;
    this_01 = Varnode::getCover(this_00);
    this_02 = Cover::getCoverBlock(this_01,i);
    iVar3 = CoverBlock::boundary(this_02,local_40);
    if (iVar3 != 2) {
      if (iVar3 == 0) break;
      p_Var5 = (_List_node_base *)&this_00->descend;
      while (p_Var5 = (((_List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_> *)&p_Var5->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != (_List_node_base *)&this_00->descend) {
        local_48 = (PcodeOp *)p_Var5[1]._M_next;
        uVar4 = CoverBlock::getUIndex(local_48);
        if (uVar4 == uVar2) {
          std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::push_back(oplist,&local_48);
          local_54 = PcodeOp::getSlot(local_48,this_00);
          std::vector<int,_std::allocator<int>_>::push_back(slotlist,&local_54);
        }
      }
    }
  }
  return local_50 == ppVVar1;
}

Assistant:

bool Merge::collectCorrectable(const vector<Varnode *> &vlist,list<PcodeOp *> &oplist,
			       vector<int4> &slotlist,PcodeOp *op)
{
  int4 blk = op->getParent()->getIndex();
  vector<Varnode *>::const_iterator viter;
  list<PcodeOp *>::const_iterator oiter;
  Varnode *vn;
  PcodeOp *edgeop;
  int4 slot,bound;
  uintm opuindex = CoverBlock::getUIndex(op);

  for(viter=vlist.begin();viter!=vlist.end();++viter) {
    vn = *viter;
    bound = vn->getCover()->getCoverBlock(blk).boundary(op);
    if (bound == 0) return false;
    if (bound == 2) continue;	// Not defined before op (intersects with write op)
    for(oiter=vn->beginDescend();oiter!=vn->endDescend();++oiter) {
      edgeop = *oiter;
      if (CoverBlock::getUIndex(edgeop) == opuindex) { // Correctable
	oplist.push_back(edgeop);
	slot = edgeop->getSlot(vn);
	slotlist.push_back(slot);
      }
    }
  }
  return true;
}